

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlCtxtNsCheckScope(xmlDebugCtxtPtr ctxt,xmlNodePtr node,xmlNsPtr ns)

{
  xmlElementType xVar1;
  int iVar2;
  xmlChar *extra;
  char *pcVar3;
  xmlNsPtr pxVar4;
  
  if ((node->type < XML_XINCLUDE_END) &&
     ((0x8220eU >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
LAB_00140bac:
    if ((node == (xmlNodePtr)0x0) || (xVar1 = node->type, XML_XINCLUDE_START < xVar1))
    goto LAB_00140c59;
    if ((0xcU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if ((0x80002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (((0x2200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) &&
           (node->nsDef == ns)) {
          return;
        }
LAB_00140c59:
        extra = ns->prefix;
        if (extra == (xmlChar *)0x0) {
          pcVar3 = "Reference to default namespace not on ancestor\n";
          iVar2 = 0x13a7;
          goto LAB_00140c36;
        }
        pcVar3 = "Reference to namespace \'%s\' not on ancestor\n";
        iVar2 = 0x13a7;
        goto LAB_00140c14;
      }
      pxVar4 = (xmlNsPtr)&node->nsDef;
      while (pxVar4 = pxVar4->next, pxVar4 != (xmlNsPtr)0x0) {
        if (pxVar4 == ns) {
          return;
        }
        iVar2 = xmlStrEqual(pxVar4->prefix,ns->prefix);
        if (iVar2 != 0) goto LAB_00140bfc;
      }
    }
    node = node->parent;
    goto LAB_00140bac;
  }
LAB_00140bfc:
  extra = ns->prefix;
  if (extra == (xmlChar *)0x0) {
    pcVar3 = "Reference to default namespace not in scope\n";
    iVar2 = 0x13a6;
LAB_00140c36:
    xmlDebugErr(ctxt,iVar2,pcVar3);
    return;
  }
  pcVar3 = "Reference to namespace \'%s\' not in scope\n";
  iVar2 = 0x13a6;
LAB_00140c14:
  xmlDebugErr3(ctxt,iVar2,pcVar3,(char *)extra);
  return;
}

Assistant:

static void
xmlCtxtNsCheckScope(xmlDebugCtxtPtr ctxt, xmlNodePtr node, xmlNsPtr ns)
{
    int ret;

    ret = xmlNsCheckScope(node, ns);
    if (ret == -2) {
        if (ns->prefix == NULL)
	    xmlDebugErr(ctxt, XML_CHECK_NS_SCOPE,
			"Reference to default namespace not in scope\n");
	else
	    xmlDebugErr3(ctxt, XML_CHECK_NS_SCOPE,
			 "Reference to namespace '%s' not in scope\n",
			 (char *) ns->prefix);
    }
    if (ret == -3) {
        if (ns->prefix == NULL)
	    xmlDebugErr(ctxt, XML_CHECK_NS_ANCESTOR,
			"Reference to default namespace not on ancestor\n");
	else
	    xmlDebugErr3(ctxt, XML_CHECK_NS_ANCESTOR,
			 "Reference to namespace '%s' not on ancestor\n",
			 (char *) ns->prefix);
    }
}